

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::load_s_ikdata_0(xr_ogf_v3 *this,xr_reader *r)

{
  bool bVar1;
  reference ppxVar2;
  __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
  local_38;
  xr_bone_vec_it end_1;
  xr_bone_vec_it it_1;
  xr_bone_vec_it end;
  xr_bone_vec_it it;
  xr_reader *r_local;
  xr_ogf_v3 *this_local;
  
  end._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::begin
                 (&(this->super_xr_ogf).super_xr_object.m_bones);
  it_1._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::end
                 (&(this->super_xr_ogf).super_xr_object.m_bones);
  while (bVar1 = __gnu_cxx::operator!=(&end,&it_1), bVar1) {
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
              ::operator*(&end);
    bone_io::import_ikdata_0((bone_io *)*ppxVar2,r);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
    ::operator++(&end);
  }
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,0x17);
  end_1._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::begin
                 (&(this->super_xr_ogf).super_xr_object.m_bones);
  local_38._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::end
                 (&(this->super_xr_ogf).super_xr_object.m_bones);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end_1,&local_38);
    if (!bVar1) {
      return;
    }
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
              ::operator*(&end_1);
    bVar1 = xr_bone::is_root(*ppxVar2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
    ::operator++(&end_1);
  }
  ppxVar2 = __gnu_cxx::
            __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
            ::operator*(&end_1);
  fix_bind(*ppxVar2);
  return;
}

Assistant:

void xr_ogf_v3::load_s_ikdata_0(xr_reader& r)
{
	for (xr_bone_vec_it it = m_bones.begin(), end = m_bones.end(); it != end; ++it)
		static_cast<bone_io*>(*it)->import_ikdata_0(r);
	set_chunk_loaded(OGF3_S_IKDATA_0);

	//� ������ ������� �� ����� OGF3_S_IKDATA_0 bind pose ������ �������� ������������ ������
	//��� ������������� ���� ����������� ������������ ������������ �����
	for (xr_bone_vec_it it = m_bones.begin(), end = m_bones.end(); it != end; ++it)
	{
		if ((*it)->is_root())
		{
			fix_bind(*it);
			break;
		}
	}
}